

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# required_fields_test.cc
# Opt level: O0

void __thiscall
RequiredFieldsTest<Edition2023Type>::CheckRequired
          (RequiredFieldsTest<Edition2023Type> *this,string_view json,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missing)

{
  bool bVar1;
  upb_Arena *puVar2;
  MessageType *msg;
  upb_DefPool *puVar3;
  const_pointer buf;
  size_type size;
  upb_MessageDef *puVar4;
  upb_Status *status_00;
  Message *message;
  char *pcVar5;
  AssertHelper local_348;
  Message local_340;
  bool local_332;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_2;
  Message local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_1;
  Message local_2e0;
  bool local_2d2;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar;
  upb_FieldPathEntry *entries;
  AssertHelper local_298;
  char *local_290;
  Message local_288;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_;
  Status status;
  MessageDefPtr m;
  MessageType *test_msg;
  undefined1 local_48 [8];
  DefPool defpool;
  Arena arena;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missing_local;
  RequiredFieldsTest<Edition2023Type> *this_local;
  string_view json_local;
  
  json_local._M_len = (size_t)json._M_str;
  this_local = (RequiredFieldsTest<Edition2023Type> *)json._M_len;
  upb::Arena::Arena((Arena *)&defpool.ptr_._M_t.
                              super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                              super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                              super__Head_base<0UL,_upb_DefPool_*,_false>);
  upb::DefPool::DefPool((DefPool *)local_48);
  puVar2 = upb::Arena::ptr((Arena *)&defpool.ptr_._M_t.
                                     super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                                     super__Head_base<0UL,_upb_DefPool_*,_false>);
  msg = Edition2023Type::NewMessage(puVar2);
  puVar3 = upb::DefPool::ptr((DefPool *)local_48);
  status.status_.msg._503_8_ = Edition2023Type::GetMessageDef(puVar3);
  upb::Status::Status((Status *)&gtest_ar_.message_);
  buf = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  size = std::basic_string_view<char,_std::char_traits<char>_>::size
                   ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  puVar4 = upb::MessageDefPtr::ptr((MessageDefPtr *)(status.status_.msg + 0x1f7));
  puVar3 = upb::DefPool::ptr((DefPool *)local_48);
  puVar2 = upb::Arena::ptr((Arena *)&defpool.ptr_._M_t.
                                     super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                                     super__Head_base<0UL,_upb_DefPool_*,_false>);
  status_00 = upb::Status::ptr((Status *)&gtest_ar_.message_);
  pcVar5 = (char *)0x0;
  local_279 = upb_JsonDecode(buf,size,&msg->base_dont_copy_me__upb_internal_use_only,puVar4,puVar3,0
                             ,puVar2,status_00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_278,&local_279,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    local_290 = upb::Status::error_message((Status *)&gtest_ar_.message_);
    message = testing::Message::operator<<(&local_288,&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&entries,(internal *)local_278,
               (AssertionResult *)
               "upb_JsonDecode(json.data(), json.size(), (&(test_msg)->base_dont_copy_me__upb_internal_use_only), m.ptr(), defpool.ptr(), 0, arena.ptr(), status.ptr())"
               ,"false","true",pcVar5);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/required_fields_test.cc"
               ,0x3b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_298,message);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    std::__cxx11::string::~string((string *)&entries);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_2d1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(missing);
  local_2d1 = !local_2d1;
  puVar4 = upb::MessageDefPtr::ptr((MessageDefPtr *)(status.status_.msg + 0x1f7));
  puVar3 = upb::DefPool::ptr((DefPool *)local_48);
  local_2d2 = upb_util_HasUnsetRequired
                        (&msg->base_dont_copy_me__upb_internal_use_only,puVar4,puVar3,
                         (upb_FieldPathEntry **)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_2d0,"!missing.empty()",
             "upb_util_HasUnsetRequired((&(test_msg)->base_dont_copy_me__upb_internal_use_only), m.ptr(), defpool.ptr(), &entries)"
             ,&local_2d1,&local_2d2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/required_fields_test.cc"
               ,0x40,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    PathsToText_abi_cxx11_
              (&local_310,
               (upb_FieldPathEntry *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    testing::internal::EqHelper::
    Compare<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              ((EqHelper *)local_2f8,"missing","PathsToText(entries)",missing,&local_310);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_310);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/required_fields_test.cc"
                 ,0x42,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_318);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_318);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
    free((void *)gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  }
  local_331 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(missing);
  local_331 = !local_331;
  puVar4 = upb::MessageDefPtr::ptr((MessageDefPtr *)(status.status_.msg + 0x1f7));
  puVar3 = upb::DefPool::ptr((DefPool *)local_48);
  local_332 = upb_util_HasUnsetRequired
                        (&msg->base_dont_copy_me__upb_internal_use_only,puVar4,puVar3,
                         (upb_FieldPathEntry **)0x0);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_330,"!missing.empty()",
             "upb_util_HasUnsetRequired((&(test_msg)->base_dont_copy_me__upb_internal_use_only), m.ptr(), defpool.ptr(), nullptr)"
             ,&local_331,&local_332);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/required_fields_test.cc"
               ,0x4a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  upb::DefPool::~DefPool((DefPool *)local_48);
  upb::Arena::~Arena((Arena *)&defpool.ptr_._M_t.
                               super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                               super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                               super__Head_base<0UL,_upb_DefPool_*,_false>);
  return;
}

Assistant:

void CheckRequired(absl::string_view json,
                     const std::vector<std::string>& missing) {
    upb::Arena arena;
    upb::DefPool defpool;
    auto* test_msg = T::NewMessage(arena.ptr());
    upb::MessageDefPtr m = T::GetMessageDef(defpool.ptr());
    upb::Status status;
    EXPECT_TRUE(upb_JsonDecode(json.data(), json.size(), UPB_UPCAST(test_msg),
                               m.ptr(), defpool.ptr(), 0, arena.ptr(),
                               status.ptr()))
        << status.error_message();
    upb_FieldPathEntry* entries = nullptr;
    EXPECT_EQ(!missing.empty(),
              upb_util_HasUnsetRequired(UPB_UPCAST(test_msg), m.ptr(),
                                        defpool.ptr(), &entries));
    if (entries) {
      EXPECT_EQ(missing, PathsToText(entries));
      free(entries);
    }

    // Verify that we can pass a NULL pointer to entries when we don't care
    // about them.
    EXPECT_EQ(!missing.empty(),
              upb_util_HasUnsetRequired(UPB_UPCAST(test_msg), m.ptr(),
                                        defpool.ptr(), nullptr));
  }